

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::lowerEqZInt64(I64ToI32Lowering *this,Unary *curr)

{
  Expression *left;
  Index index;
  pointer this_00;
  pointer this_01;
  pointer this_02;
  LocalGet *right;
  Binary *value;
  unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_> *this_03;
  Type local_48;
  Unary *local_40;
  Unary *result;
  TempVar highBits;
  Unary *curr_local;
  I64ToI32Lowering *this_local;
  
  highBits.ty.id = (uintptr_t)curr;
  fetchOutParam((TempVar *)&result,this,curr->value);
  this_03 = &this->builder;
  this_00 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_03)
  ;
  this_01 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_03)
  ;
  left = *(Expression **)(highBits.ty.id + 0x18);
  this_02 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->(this_03)
  ;
  index = TempVar::operator_cast_to_unsigned_int((TempVar *)&result);
  wasm::Type::Type(&local_48,i32);
  right = Builder::makeLocalGet(this_02,index,local_48);
  value = Builder::makeBinary(this_01,OrInt32,left,(Expression *)right);
  local_40 = Builder::makeUnary(this_00,EqZInt32,(Expression *)value);
  Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
            (&(this->
              super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
              ).
              super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
              .super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>,
             (Expression *)local_40);
  TempVar::~TempVar((TempVar *)&result);
  return;
}

Assistant:

void lowerEqZInt64(Unary* curr) {
    TempVar highBits = fetchOutParam(curr->value);

    auto* result = builder->makeUnary(
      EqZInt32,
      builder->makeBinary(
        OrInt32, curr->value, builder->makeLocalGet(highBits, Type::i32)));

    replaceCurrent(result);
  }